

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManMergeDist1All(Mop_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vStats,int nLimit)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vGroup;
  Vec_Int_t *vGroupPrev;
  int iVar3;
  int i;
  
  iVar3 = 0;
  i = vGroups->nSize;
  while( true ) {
    do {
      iVar2 = i;
      if (iVar2 < 1) {
        return iVar3;
      }
      i = iVar2 + -1;
      vGroup = Vec_WecEntry(vGroups,i);
    } while (vGroup->nSize == 0);
    if (i == 0) break;
    iVar1 = Mop_ManRemoveIdentical(p,vGroup);
    vGroupPrev = Vec_WecEntry(vGroups,iVar2 + -2);
    iVar2 = Mop_ManMergeDist1Pairs(p,vGroup,vGroupPrev,vStats,nLimit);
    iVar3 = iVar1 + iVar3 + iVar2;
  }
  puts("Detected constant-1 cover.");
  fflush(_stdout);
  return -1;
}

Assistant:

int Mop_ManMergeDist1All( Mop_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vGroup;
    int i, nEqual, nReduce, Count = 0;
    Vec_WecForEachLevelReverse( vGroups, vGroup, i )
    {
        if ( Vec_IntSize(vGroup) == 0 )
            continue;
        if ( i == 0 )
        {
            printf( "Detected constant-1 cover.\n" );
            fflush( stdout );
            return -1;
        }
        nEqual  = Mop_ManRemoveIdentical( p, vGroup );
        nReduce = Mop_ManMergeDist1Pairs( p, vGroup, Vec_WecEntry(vGroups, i-1), vStats, nLimit );
        //Mop_ManMergeDist1Pairs2( p, vGroup, Vec_WecEntry(vGroups, i-1) );
        Count  += nEqual + nReduce;
        //printf( "Group %3d : Equal =%5d. Reduce =%5d.\n", i, nEqual, nReduce );
    }
    return Count;
}